

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForwardingTimeCoordinator.cpp
# Opt level: O0

bool __thiscall
helics::ForwardingTimeCoordinator::updateTimeFactors(ForwardingTimeCoordinator *this)

{
  TimeDependencies *pTVar1;
  bool bVar2;
  action_t aVar3;
  GlobalFederateId id;
  TimeDependencies *in_RDI;
  ActionMessage upd_delayed_1;
  DependencyInfo dependency_1;
  TimeData minTimeUpstream;
  ActionMessage upd_2;
  ActionMessage upd_delayed;
  DependencyInfo dependency;
  TimeData td;
  ActionMessage upd_1;
  ActionMessage upd;
  bool updateDownStream;
  bool updateUpStream;
  TimeData mTimeDownstream;
  TimeData mTimeUpstream;
  ActionMessage *in_stack_fffffffffffff9c8;
  undefined7 in_stack_fffffffffffff9d0;
  undefined1 in_stack_fffffffffffff9d7;
  byte bVar4;
  ActionMessage *in_stack_fffffffffffff9e8;
  TimeData *update;
  ForwardingTimeCoordinator *in_stack_fffffffffffff9f0;
  TimeData *this_00;
  int32_t in_stack_fffffffffffffa10;
  bool in_stack_fffffffffffffa17;
  undefined1 restricted;
  GlobalFederateId in_stack_fffffffffffffa20;
  GlobalFederateId in_stack_fffffffffffffa24;
  ForwardingTimeCoordinator *in_stack_fffffffffffffa28;
  GlobalFederateId in_stack_fffffffffffffa34;
  int32_t in_stack_fffffffffffffa44;
  TimeData *in_stack_fffffffffffffa48;
  BaseTimeCoordinator *in_stack_fffffffffffffa50;
  GlobalFederateId in_stack_fffffffffffffa5c;
  GlobalFederateId local_470;
  GlobalFederateId local_46c;
  ActionMessage local_468;
  BaseType local_3ac;
  TimeData local_2f0;
  BaseType local_298;
  undefined4 local_294;
  BaseType local_248;
  GlobalFederateId local_244;
  ActionMessage local_240;
  BaseType local_188;
  GlobalFederateId local_174;
  ActionMessage local_170;
  TimeRepresentation<count_time<9,_long>_> local_b8;
  byte local_aa;
  bool local_a9;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined1 local_a0 [40];
  GlobalFederateId local_78 [2];
  byte local_70;
  undefined4 local_58;
  undefined4 local_54;
  undefined1 local_50 [48];
  byte local_20;
  
  local_54 = *(undefined4 *)
              &in_RDI[2].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_58 = 0x8831d580;
  generateMinTimeUpstream
            (in_RDI,in_stack_fffffffffffffa17,in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,
             in_stack_fffffffffffffa10);
  if (((ulong)in_RDI[2].dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 1) == 0) {
    local_a4 = *(undefined4 *)
                &in_RDI[2].dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    local_a8 = 0x8831d580;
    generateMinTimeDownstream
              (in_RDI,in_stack_fffffffffffffa17,in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,
               in_stack_fffffffffffffa10);
  }
  else {
    memcpy(local_a0,local_50,0x48);
  }
  local_a9 = false;
  local_aa = 0;
  if ((3 < local_20) ||
     (((ulong)in_RDI[2].dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0)) {
    local_a9 = TimeData::update((TimeData *)in_stack_fffffffffffff9f0,
                                (TimeData *)in_stack_fffffffffffff9e8);
  }
  if ((3 < local_70) ||
     (((ulong)in_RDI[2].dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) == 0)) {
    local_aa = TimeData::update((TimeData *)in_stack_fffffffffffff9f0,
                                (TimeData *)in_stack_fffffffffffff9e8);
  }
  if (*(char *)&in_RDI[4].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish == '\b') {
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)
                       &in_RDI[3].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish,
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 6));
    if (bVar2) {
      in_RDI[6].dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start =
           in_RDI[3].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_finish;
    }
    bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 3),
                       (TimeRepresentation<count_time<9,_long>_> *)&in_RDI[5].mDelayedDependency);
    if (bVar2) {
      *(pointer *)&in_RDI[5].mDelayedDependency =
           in_RDI[3].dependencies.
           super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  restricted = false;
  if (((ulong)in_RDI[2].dependencies.
              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage & 0x100000000) == 0) {
    pTVar1 = in_RDI + 3;
    local_b8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
    restricted = TimeRepresentation<count_time<9,_long>_>::operator<
                           ((TimeRepresentation<count_time<9,_long>_> *)
                            &(pTVar1->dependencies).
                             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
  }
  if ((bool)restricted != false) {
    TimeRepresentation<count_time<9,_long>_>::operator>
              ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 6),
               (TimeRepresentation<count_time<9,_long>_> *)
               &in_RDI[5].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  *(int *)((long)&in_RDI[2].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 4) =
       *(int *)((long)&in_RDI[4].dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) +
       *(int *)((long)&in_RDI[8].dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 4);
  if (((local_a9 & 1U) != 0) || ((local_aa & 1) != 0)) {
    memset(&local_174,0,4);
    GlobalFederateId::GlobalFederateId(&local_174);
    BaseTimeCoordinator::generateTimeRequest
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa44);
    aVar3 = ActionMessage::action(&local_170);
    if (aVar3 != cmd_ignore) {
      transmitTimingMessagesUpstream(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    }
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
  }
  if ((local_aa & 1) == 0) {
    bVar2 = TimeDependencies::hasDelayedDependency((TimeDependencies *)0x55ec86);
    if (bVar2) {
      id = TimeDependencies::delayedDependency
                     ((TimeDependencies *)
                      &(in_RDI->dependencies).
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      bVar2 = GlobalFederateId::operator==(local_78,id);
      if ((bVar2) &&
         (((ulong)in_RDI[2].dependencies.
                  super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x1000000) != 0)) {
        generateMinTimeUpstream
                  (in_RDI,(bool)restricted,in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,
                   in_stack_fffffffffffffa10);
        DependencyInfo::DependencyInfo
                  ((DependencyInfo *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        TimeData::update((TimeData *)in_stack_fffffffffffff9f0,(TimeData *)in_stack_fffffffffffff9e8
                        );
        BaseTimeCoordinator::generateTimeRequest
                  (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa5c,
                   in_stack_fffffffffffffa44);
        bVar2 = std::function::operator_cast_to_bool
                          ((function<void_(const_helics::ActionMessage_&)> *)
                           CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        if (bVar2) {
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    ((function<void_(const_helics::ActionMessage_&)> *)
                     CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8);
        }
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
      }
    }
  }
  else {
    bVar2 = TimeDependencies::hasDelayedDependency((TimeDependencies *)0x55e98b);
    if (bVar2) {
      pTVar1 = in_RDI + 6;
      local_188 = (BaseType)
                  TimeDependencies::delayedDependency
                            ((TimeDependencies *)
                             &(in_RDI->dependencies).
                              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      bVar2 = GlobalFederateId::operator==(&pTVar1->mDelayedDependency,(GlobalFederateId)local_188);
      if (bVar2) {
        this_00 = (TimeData *)
                  &in_RDI[5].dependencies.
                   super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        memset(&local_244,0,4);
        GlobalFederateId::GlobalFederateId(&local_244);
        BaseTimeCoordinator::generateTimeRequest
                  (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa5c,
                   in_stack_fffffffffffffa44);
        aVar3 = ActionMessage::action(&local_240);
        if (aVar3 != cmd_ignore) {
          local_248 = in_RDI[6].mDelayedDependency.gid;
          transmitTimingMessagesDownstream
                    (in_stack_fffffffffffffa28,
                     (ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffa24.gid,in_stack_fffffffffffffa20.gid),
                     in_stack_fffffffffffffa34);
        }
        local_294 = *(undefined4 *)
                     &in_RDI[2].dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_298 = in_RDI[6].mDelayedDependency.gid;
        generateMinTimeUpstream
                  (in_RDI,(bool)restricted,in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,
                   in_stack_fffffffffffffa10);
        update = &local_2f0;
        DependencyInfo::DependencyInfo
                  ((DependencyInfo *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        TimeData::update(this_00,update);
        local_3ac = in_RDI[6].mDelayedDependency.gid;
        BaseTimeCoordinator::generateTimeRequest
                  (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa5c,
                   in_stack_fffffffffffffa44);
        bVar2 = std::function::operator_cast_to_bool
                          ((function<void_(const_helics::ActionMessage_&)> *)
                           CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        if (bVar2) {
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    ((function<void_(const_helics::ActionMessage_&)> *)
                     CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0),
                     in_stack_fffffffffffff9c8);
        }
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        ActionMessage::~ActionMessage
                  ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
        goto LAB_0055edd0;
      }
    }
    memset(&local_46c,0,4);
    GlobalFederateId::GlobalFederateId(&local_46c);
    BaseTimeCoordinator::generateTimeRequest
              (in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,in_stack_fffffffffffffa5c,
               in_stack_fffffffffffffa44);
    aVar3 = ActionMessage::action(&local_468);
    if (aVar3 != cmd_ignore) {
      local_470.gid = 0;
      GlobalFederateId::GlobalFederateId(&local_470);
      transmitTimingMessagesDownstream
                (in_stack_fffffffffffffa28,
                 (ActionMessage *)
                 CONCAT44(in_stack_fffffffffffffa24.gid,in_stack_fffffffffffffa20.gid),
                 in_stack_fffffffffffffa34);
    }
    ActionMessage::~ActionMessage
              ((ActionMessage *)CONCAT17(in_stack_fffffffffffff9d7,in_stack_fffffffffffff9d0));
  }
LAB_0055edd0:
  bVar4 = 1;
  if ((local_a9 & 1U) == 0) {
    bVar4 = local_aa;
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool ForwardingTimeCoordinator::updateTimeFactors()
{
    auto mTimeUpstream = generateMinTimeUpstream(
        dependencies, restrictive_time_policy, mSourceId, NoIgnoredFederates, sequenceCounter);
    auto mTimeDownstream = (noParent) ? mTimeUpstream :
                                        generateMinTimeDownstream(dependencies,
                                                                  restrictive_time_policy,
                                                                  mSourceId,
                                                                  NoIgnoredFederates,
                                                                  sequenceCounter);

    bool updateUpStream{false};
    bool updateDownStream{false};
    if (mTimeUpstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateUpStream = upstream.update(mTimeUpstream);
    }
    if (mTimeDownstream.mTimeState > TimeState::exec_requested || !executionMode) {
        updateDownStream = downstream.update(mTimeDownstream);
    }

    if (upstream.mTimeState == TimeState::time_requested) {
        if (upstream.minDe < downstream.minDe) {
            downstream.minDe = upstream.minDe;
        }
        if (upstream.Te < downstream.Te) {
            downstream.Te = upstream.Te;
        }
    }
    if (!restrictive_time_policy && upstream.minDe < Time::maxVal()) {
        if (downstream.minDe > downstream.next) {
            //     downstream.next = downstream.minminDe;
        }
    }

    sequenceCounter = upstream.sequenceCounter + sequenceModifier;
    if (updateUpStream || updateDownStream) {
        auto upd =
            generateTimeRequest(upstream, GlobalFederateId{}, upstream.responseSequenceCounter);
        if (upd.action() != CMD_IGNORE) {
            transmitTimingMessagesUpstream(upd);
        }
    }
    if (updateDownStream) {
        if (dependencies.hasDelayedDependency() &&
            downstream.minFed == dependencies.delayedDependency()) {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd, downstream.minFed);
            }
            auto td = generateMinTimeUpstream(
                dependencies, restrictive_time_policy, mSourceId, downstream.minFed, 0);
            DependencyInfo dependency;
            dependency.update(td);
            auto upd_delayed = generateTimeRequest(dependency,
                                                   downstream.minFed,
                                                   dependency.responseSequenceCounter);
            if (sendMessageFunction) {
                sendMessageFunction(upd_delayed);
            }
        } else {
            auto upd = generateTimeRequest(downstream, GlobalFederateId{}, 0);
            if (upd.action() != CMD_IGNORE) {
                transmitTimingMessagesDownstream(upd);
            }
        }
    } else if (dependencies.hasDelayedDependency() &&
               mTimeDownstream.minFed == dependencies.delayedDependency() && executionMode) {
        auto minTimeUpstream = generateMinTimeUpstream(
            dependencies, restrictive_time_policy, mSourceId, mTimeDownstream.minFed, 0);
        DependencyInfo dependency;
        dependency.update(minTimeUpstream);
        auto upd_delayed = generateTimeRequest(dependency,
                                               mTimeDownstream.minFed,
                                               dependency.responseSequenceCounter);
        if (sendMessageFunction) {
            sendMessageFunction(upd_delayed);
        }
    }
    return (updateUpStream || updateDownStream);
}